

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall OpaqueType::fromBuffer(OpaqueType *this,uint8_t *buf,size_t max_len)

{
  uint8_t *puVar1;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  OpaqueType *this_local;
  
  this_local._4_4_ = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < this_local._4_4_) {
    puVar1 = (uint8_t *)calloc((long)(this->super_BER_CONTAINER)._length,1);
    this->_value = puVar1;
    memcpy(this->_value,buf + this_local._4_4_,(long)(this->super_BER_CONTAINER)._length);
    this->_dataLength = (this->super_BER_CONTAINER)._length;
    this_local._4_4_ = (this->super_BER_CONTAINER)._length + this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int OpaqueType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    _value = (uint8_t*)calloc(_length, sizeof(char));
    memcpy(_value, (char*)ptr, _length);
    _dataLength = _length;

    return _length + i;
}